

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall
Assimp::MD3Importer::ConvertPath(MD3Importer *this,char *texture_name,char *header_name,string *out)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar2 = strrchr(header_name,0x5c);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strrchr(header_name,0x2f);
  }
  pcVar3 = strrchr(texture_name,0x5c);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strrchr(texture_name,0x2f);
  }
  if (pcVar3 == (char *)0x0) {
LAB_00449270:
    pcVar2 = (char *)out->_M_string_length;
    strlen(texture_name);
  }
  else {
    if (texture_name == (char *)0x0) {
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                    ,0xbf,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
    }
    iVar1 = strncasecmp(texture_name,"models",6);
    if ((iVar1 == 0) && ((texture_name[6] == '\\' || (texture_name[6] == '/')))) {
      uVar4 = 6;
      if (*header_name != '\0') goto LAB_00449252;
    }
    else {
      uVar4 = (long)pcVar3 - (long)texture_name;
      if ((ulong)((long)pcVar2 - (long)header_name) <= (ulong)((long)pcVar3 - (long)texture_name)) {
        uVar4 = (long)pcVar2 - (long)header_name;
      }
LAB_00449252:
      if (header_name == (char *)0x0) {
        __assert_fail("__null != s2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                      ,0xc0,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)")
        ;
      }
      if ((int)uVar4 != 0) {
        iVar1 = strncasecmp(texture_name,header_name,uVar4 & 0xffffffff);
        if (iVar1 != 0) goto LAB_00449270;
      }
    }
    texture_name = pcVar3 + 1;
    pcVar2 = (char *)out->_M_string_length;
    strlen(texture_name);
  }
  std::__cxx11::string::_M_replace((ulong)out,0,pcVar2,(ulong)texture_name);
  return;
}

Assistant:

void MD3Importer::ConvertPath(const char* texture_name, const char* header_name, std::string& out) const
{
    // If the MD3's internal path itself and the given path are using
    // the same directory, remove it completely to get right output paths.
    const char* end1 = ::strrchr(header_name,'\\');
    if (!end1)end1   = ::strrchr(header_name,'/');

    const char* end2 = ::strrchr(texture_name,'\\');
    if (!end2)end2   = ::strrchr(texture_name,'/');

    // HACK: If the paths starts with "models", ignore the
    // next two hierarchy levels, it specifies just the model name.
    // Ignored by Q3, it might be not equal to the real model location.
    if (end2)   {

        size_t len2;
        const size_t len1 = (size_t)(end1 - header_name);
        if (!ASSIMP_strincmp(texture_name,"models",6) && (texture_name[6] == '/' || texture_name[6] == '\\')) {
            len2 = 6; // ignore the seventh - could be slash or backslash

            if (!header_name[0]) {
                // Use the file name only
                out = end2+1;
                return;
            }
        }
        else len2 = std::min (len1, (size_t)(end2 - texture_name ));
        if (!ASSIMP_strincmp(texture_name,header_name,static_cast<unsigned int>(len2))) {
            // Use the file name only
            out = end2+1;
            return;
        }
    }
    // Use the full path
    out = texture_name;
}